

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbstrmatrix.cpp
# Opt level: O2

TPZStructMatrix * __thiscall
TPZBandStructMatrix<double,_TPZStructMatrixOR<double>_>::Clone
          (TPZBandStructMatrix<double,_TPZStructMatrixOR<double>_> *this)

{
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xb8);
  TPZBandStructMatrix((TPZBandStructMatrix<double,_TPZStructMatrixOR<double>_> *)this_00,this);
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZBandStructMatrix(*this);
}